

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiTabItem *pIVar1;
  int *piVar2;
  float *pfVar3;
  ImGuiID IVar4;
  ImGuiWindow *pIVar5;
  ImGuiTabBarSortItem *pIVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ImGuiID IVar14;
  ImGuiID IVar15;
  ImGuiContext *pIVar16;
  ImGuiContext *pIVar17;
  bool bVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  char *__dest;
  uint uVar22;
  ulong uVar23;
  char *pcVar24;
  ulong uVar25;
  ulong uVar26;
  ImGuiTabItem *pIVar27;
  ImGuiTabItem *pIVar28;
  ImGuiTabItem *pIVar29;
  long lVar30;
  ImVec2 IVar31;
  uint uVar32;
  ImGuiID IVar33;
  int iVar34;
  long lVar35;
  ImGuiID *pIVar36;
  ImVec2 unaff_R14;
  ImGuiID *pIVar37;
  size_t size;
  bool bVar38;
  bool bVar39;
  float fVar40;
  ImVec2 IVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  ImGuiTabItem item_tmp;
  ImVec4 local_88;
  ImVec2 local_70;
  ImVec4 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar17 = GImGui;
  tab_bar->WantLayout = false;
  uVar32 = (tab_bar->Tabs).Size;
  uVar25 = (ulong)uVar32;
  if ((int)uVar32 < 1) {
    uVar22 = 0;
  }
  else {
    lVar21 = 0;
    uVar23 = 0;
    uVar22 = 0;
    do {
      pIVar27 = (tab_bar->Tabs).Data;
      pIVar36 = (ImGuiID *)((long)&pIVar27->ID + lVar21);
      if (*(int *)((long)&pIVar27->LastFrameVisible + lVar21) < tab_bar->PrevFrameVisible) {
        if (*pIVar36 == tab_bar->SelectedTabId) {
          tab_bar->SelectedTabId = 0;
        }
      }
      else {
        if (uVar23 != uVar22) {
          if ((int)uVar25 <= (int)uVar22) goto LAB_00148c54;
          IVar33 = pIVar36[0];
          IVar4 = pIVar36[1];
          IVar14 = pIVar36[2];
          IVar15 = pIVar36[3];
          fVar42 = (float)pIVar36[5];
          fVar46 = (float)pIVar36[6];
          fVar43 = (float)pIVar36[7];
          piVar2 = &pIVar27[(int)uVar22].NameOffset;
          *piVar2 = pIVar36[4];
          piVar2[1] = (int)fVar42;
          piVar2[2] = (int)fVar46;
          piVar2[3] = (int)fVar43;
          pIVar27 = pIVar27 + (int)uVar22;
          pIVar27->ID = IVar33;
          pIVar27->Flags = IVar4;
          pIVar27->LastFrameVisible = IVar14;
          pIVar27->LastFrameSelected = IVar15;
        }
        uVar22 = uVar22 + 1;
      }
      uVar23 = uVar23 + 1;
      uVar32 = (tab_bar->Tabs).Size;
      uVar25 = (ulong)(int)uVar32;
      lVar21 = lVar21 + 0x20;
    } while ((long)uVar23 < (long)uVar25);
  }
  if (uVar32 != uVar22) {
    iVar19 = (tab_bar->Tabs).Capacity;
    if (iVar19 < (int)uVar22) {
      if (iVar19 == 0) {
        uVar32 = 8;
      }
      else {
        uVar32 = iVar19 / 2 + iVar19;
      }
      if ((int)uVar32 <= (int)uVar22) {
        uVar32 = uVar22;
      }
      if (iVar19 < (int)uVar32) {
        unaff_R14 = (ImVec2)MemAlloc((long)(int)uVar32 << 5);
        pIVar27 = (tab_bar->Tabs).Data;
        if (pIVar27 != (ImGuiTabItem *)0x0) {
          memcpy((void *)unaff_R14,pIVar27,(long)(tab_bar->Tabs).Size << 5);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = (ImGuiTabItem *)unaff_R14;
        (tab_bar->Tabs).Capacity = uVar32;
      }
    }
    (tab_bar->Tabs).Size = uVar22;
  }
  IVar33 = tab_bar->NextSelectedTabId;
  if (IVar33 == 0) {
    IVar33 = 0;
  }
  else {
    tab_bar->SelectedTabId = IVar33;
    tab_bar->NextSelectedTabId = 0;
  }
  IVar4 = tab_bar->ReorderRequestTabId;
  if (IVar4 != 0) {
    uVar25 = (ulong)(tab_bar->Tabs).Size;
    bVar38 = 0 < (long)uVar25;
    if (0 < (long)uVar25) {
      unaff_R14 = (ImVec2)(tab_bar->Tabs).Data;
      bVar38 = true;
      if (*(ImGuiID *)unaff_R14 != IVar4) {
        IVar41 = (ImVec2)((long)unaff_R14 + (uVar25 - 1) * 0x20);
        uVar23 = 1;
        IVar31 = unaff_R14;
        do {
          uVar26 = uVar23;
          unaff_R14 = IVar41;
          if (uVar25 == uVar26) break;
          unaff_R14 = (ImVec2)((long)IVar31 + 0x20);
          pIVar36 = (ImGuiID *)((long)IVar31 + 0x20);
          uVar23 = uVar26 + 1;
          IVar31 = unaff_R14;
        } while (*pIVar36 != IVar4);
        bVar38 = uVar26 < uVar25;
      }
    }
    if ((bVar38) && (unaff_R14 != (ImVec2)0x0)) {
      iVar19 = ImGuiTabBar::GetTabOrder(tab_bar,(ImGuiTabItem *)unaff_R14);
      uVar32 = iVar19 + tab_bar->ReorderRequestDir;
      if ((-1 < (int)uVar32) && ((int)uVar32 < (tab_bar->Tabs).Size)) {
        pIVar28 = (tab_bar->Tabs).Data;
        local_68._0_8_ = *(undefined8 *)unaff_R14;
        local_68._8_8_ = *(undefined8 *)((long)unaff_R14 + 8);
        local_58 = *(undefined8 *)((long)unaff_R14 + 0x10);
        uStack_50 = *(undefined8 *)((long)unaff_R14 + 0x18);
        uVar7 = *(undefined8 *)(pIVar28 + uVar32);
        uVar8 = *(undefined8 *)&pIVar28[uVar32].LastFrameVisible;
        uVar9 = *(undefined8 *)(&pIVar28[uVar32].NameOffset + 2);
        *(undefined8 *)((long)unaff_R14 + 0x10) = *(undefined8 *)&pIVar28[uVar32].NameOffset;
        *(undefined8 *)((long)unaff_R14 + 0x18) = uVar9;
        *(undefined8 *)unaff_R14 = uVar7;
        *(undefined8 *)((long)unaff_R14 + 8) = uVar8;
        pIVar27 = pIVar28 + uVar32;
        pIVar27->ID = (ImGuiID)local_68.x;
        pIVar27->Flags = (ImGuiTabItemFlags)local_68.y;
        pIVar27->LastFrameVisible = (int)local_68.z;
        pIVar27->LastFrameSelected = (int)local_68.w;
        pIVar27 = pIVar28 + uVar32;
        pIVar27->NameOffset = (int)local_58;
        pIVar27->Offset = (float)(int)((ulong)local_58 >> 0x20);
        *(undefined8 *)(&pIVar27->NameOffset + 2) = uStack_50;
        if (pIVar28[uVar32].ID == tab_bar->SelectedTabId) {
          IVar33 = pIVar28[uVar32].ID;
        }
      }
      if ((tab_bar->Flags & 0x400000) != 0) {
        MarkIniSettingsDirty();
      }
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar16 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar5 = GImGui->CurrentWindow;
    fVar42 = (GImGui->Style).FramePadding.y;
    fVar46 = GImGui->FontSize;
    unaff_R14 = (pIVar5->DC).CursorPos;
    fVar43 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar42;
    (pIVar5->DC).CursorPos.y = fVar43;
    (tab_bar->BarRect).Min.x = fVar46 + fVar42 + (tab_bar->BarRect).Min.x;
    local_68.x = (pIVar16->Style).Colors[0].x;
    local_68.y = (pIVar16->Style).Colors[0].y;
    uVar10 = (pIVar16->Style).Colors[0].z;
    uVar11 = (pIVar16->Style).Colors[0].w;
    local_68.w = (float)uVar11 * 0.5;
    local_68.z = (float)uVar10;
    pIVar36 = (ImGuiID *)0x0;
    PushStyleColor(0,&local_68);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    bVar38 = BeginCombo("##v",(char *)0x0,0x40);
    PopStyleColor(2);
    if (bVar38) {
      if ((tab_bar->Tabs).Size < 1) {
        pIVar36 = (ImGuiID *)0x0;
      }
      else {
        lVar21 = 0;
        lVar35 = 0;
        pIVar36 = (ImGuiID *)0x0;
        do {
          pIVar27 = (tab_bar->Tabs).Data;
          iVar19 = *(int *)((long)&pIVar27->NameOffset + lVar21);
          if (((long)iVar19 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar19)) goto LAB_00148c16;
          pIVar37 = (ImGuiID *)((long)&pIVar27->ID + lVar21);
          local_88.x = 0.0;
          local_88.y = 0.0;
          bVar38 = Selectable((tab_bar->TabsNames).Buf.Data + iVar19,
                              tab_bar->SelectedTabId == *pIVar37,0,(ImVec2 *)&local_88);
          if (bVar38) {
            pIVar36 = pIVar37;
          }
          lVar35 = lVar35 + 1;
          lVar21 = lVar21 + 0x20;
        } while (lVar35 < (tab_bar->Tabs).Size);
      }
      EndPopup();
    }
    (pIVar5->DC).CursorPos = unaff_R14;
    if (pIVar36 != (ImGuiID *)0x0) {
      IVar33 = *pIVar36;
      tab_bar->SelectedTabId = IVar33;
    }
  }
  iVar19 = (tab_bar->Tabs).Size;
  iVar20 = (pIVar17->TabSortByWidthBuffer).Capacity;
  if (iVar20 < iVar19) {
    if (iVar20 == 0) {
      iVar34 = 8;
    }
    else {
      iVar34 = iVar20 / 2 + iVar20;
    }
    if (iVar34 <= iVar19) {
      iVar34 = iVar19;
    }
    if (iVar20 < iVar34) {
      unaff_R14 = (ImVec2)MemAlloc((long)iVar34 << 3);
      pIVar6 = (pIVar17->TabSortByWidthBuffer).Data;
      if (pIVar6 != (ImGuiTabBarSortItem *)0x0) {
        memcpy((void *)unaff_R14,pIVar6,(long)(pIVar17->TabSortByWidthBuffer).Size << 3);
        MemFree((pIVar17->TabSortByWidthBuffer).Data);
      }
      (pIVar17->TabSortByWidthBuffer).Data = (ImGuiTabBarSortItem *)unaff_R14;
      (pIVar17->TabSortByWidthBuffer).Capacity = iVar34;
    }
  }
  (pIVar17->TabSortByWidthBuffer).Size = iVar19;
  uVar32 = (tab_bar->Tabs).Size;
  uVar25 = (ulong)uVar32;
  if ((int)uVar32 < 1) {
    bVar38 = true;
    IVar31.x = 0.0;
    IVar31.y = 0.0;
    fVar42 = 0.0;
  }
  else {
    fVar42 = 0.0;
    lVar21 = 0;
    lVar35 = 0;
    IVar31.x = 0.0;
    IVar31.y = 0.0;
    unaff_R14.x = 0.0;
    unaff_R14.y = 0.0;
    do {
      pIVar27 = (tab_bar->Tabs).Data;
      if (*(int *)((long)&pIVar27->LastFrameVisible + lVar21) < tab_bar->PrevFrameVisible) {
        __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_widgets.cpp"
                      ,0x18df,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      if ((IVar31 == (ImVec2)0x0) ||
         ((int)*(float *)((long)IVar31 + 0xc) < *(int *)((long)&pIVar27->LastFrameSelected + lVar21)
         )) {
        IVar31 = (ImVec2)((long)&pIVar27->ID + lVar21);
      }
      if (*(ImGuiID *)((long)&pIVar27->ID + lVar21) == tab_bar->SelectedTabId) {
        unaff_R14.x = 1.4013e-45;
        unaff_R14.y = 0.0;
      }
      iVar19 = *(int *)((long)&pIVar27->NameOffset + lVar21);
      if (((long)iVar19 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar19)) {
LAB_00148c16:
        __assert_fail("tab->NameOffset != -1 && tab->NameOffset < TabsNames.Buf.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_internal.h"
                      ,0x55e,"const char *ImGuiTabBar::GetTabName(const ImGuiTabItem *) const");
      }
      IVar41 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data + iVar19,
                               (*(uint *)((long)&pIVar27->Flags + lVar21) >> 0x14 & 1) == 0);
      fVar46 = IVar41.x;
      *(float *)((long)&pIVar27->WidthContents + lVar21) = fVar46;
      if (lVar35 == 0) {
        fVar43 = 0.0;
      }
      else {
        fVar43 = (pIVar17->Style).ItemInnerSpacing.x;
      }
      if ((pIVar17->TabSortByWidthBuffer).Size <= lVar35) goto LAB_00148bf7;
      fVar42 = fVar42 + fVar43 + fVar46;
      pIVar6 = (pIVar17->TabSortByWidthBuffer).Data;
      pIVar6[lVar35].Index = (int)lVar35;
      pIVar6[lVar35].Width = fVar46;
      lVar35 = lVar35 + 1;
      uVar25 = (ulong)(tab_bar->Tabs).Size;
      lVar21 = lVar21 + 0x20;
    } while (lVar35 < (long)uVar25);
    bVar38 = unaff_R14 == (ImVec2)0x0;
  }
  fVar46 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  fVar42 = (float)(-(uint)(fVar46 < fVar42) & (uint)(fVar42 - fVar46));
  if ((fVar42 <= 0.0) || ((tab_bar->Flags & 0x40) == 0)) {
    if (0 < (int)uVar25) {
      fVar42 = GImGui->FontSize * 20.0;
      pIVar27 = (tab_bar->Tabs).Data;
      lVar21 = 0;
      do {
        fVar46 = *(float *)((long)&pIVar27->WidthContents + lVar21);
        if (fVar42 <= fVar46) {
          fVar46 = fVar42;
        }
        *(float *)((long)&pIVar27->Width + lVar21) = fVar46;
        lVar21 = lVar21 + 0x20;
      } while ((uVar25 & 0xffffffff) << 5 != lVar21);
    }
  }
  else {
    if (1 < (int)uVar25) {
      qsort((pIVar17->TabSortByWidthBuffer).Data,(long)(pIVar17->TabSortByWidthBuffer).Size,8,
            TabBarSortItemComparer);
    }
    uVar32 = (tab_bar->Tabs).Size;
    uVar25 = 1;
    do {
      iVar19 = (int)uVar25;
      if ((int)uVar32 <= iVar19) break;
      uVar22 = (pIVar17->TabSortByWidthBuffer).Size;
      if ((int)uVar22 < 1) goto LAB_00148bf7;
      uVar23 = (ulong)uVar22;
      if ((int)uVar22 < iVar19) {
        uVar23 = uVar25;
      }
      lVar35 = (long)iVar19 << 0x20;
      bVar39 = true;
      lVar21 = (long)iVar19;
      do {
        lVar30 = lVar21 + 1;
        if (lVar30 - uVar23 == 1) goto LAB_00148bf7;
        pIVar6 = (pIVar17->TabSortByWidthBuffer).Data;
        fVar46 = pIVar6->Width;
        pfVar3 = &pIVar6[lVar21].Width;
        if ((fVar46 != *pfVar3) || (NAN(fVar46) || NAN(*pfVar3))) {
          if (bVar39) {
            iVar19 = (pIVar17->TabSortByWidthBuffer).Size;
            if ((iVar19 < 1) || (iVar19 <= (int)uVar25)) goto LAB_00148bf7;
            pIVar6 = (pIVar17->TabSortByWidthBuffer).Data;
            fVar46 = pIVar6->Width - *(float *)((long)&pIVar6->Width + (lVar35 >> 0x1d));
            goto LAB_001484fc;
          }
          break;
        }
        bVar39 = lVar30 < (int)uVar32;
        lVar35 = lVar35 + 0x100000000;
        uVar22 = (int)uVar25 + 1;
        uVar25 = (ulong)uVar22;
        lVar21 = lVar30;
      } while (uVar32 != uVar22);
      if ((pIVar17->TabSortByWidthBuffer).Size < 1) goto LAB_00148bf7;
      fVar46 = ((pIVar17->TabSortByWidthBuffer).Data)->Width + -1.0;
LAB_001484fc:
      fVar45 = (float)(int)uVar25;
      fVar43 = fVar42 / fVar45;
      if (fVar46 <= fVar43) {
        fVar43 = fVar46;
      }
      if (0 < (int)uVar25) {
        uVar22 = (pIVar17->TabSortByWidthBuffer).Size;
        uVar23 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          uVar23 = 0;
        }
        uVar26 = 0;
        do {
          if (uVar23 == uVar26) goto LAB_00148bf7;
          pIVar6 = (pIVar17->TabSortByWidthBuffer).Data;
          pIVar6[uVar26].Width = pIVar6[uVar26].Width - fVar43;
          uVar26 = uVar26 + 1;
        } while (uVar25 != uVar26);
      }
      fVar42 = fVar42 - fVar43 * fVar45;
    } while (0.0 < fVar42);
    iVar19 = (tab_bar->Tabs).Size;
    unaff_R14 = IVar31;
    if (0 < (long)iVar19) {
      uVar32 = (pIVar17->TabSortByWidthBuffer).Size;
      uVar23 = 0;
      uVar25 = (ulong)uVar32;
      if ((int)uVar32 < 1) {
        uVar25 = 0;
      }
      do {
        if (uVar25 == uVar23) goto LAB_00148bf7;
        pIVar6 = (pIVar17->TabSortByWidthBuffer).Data;
        iVar20 = pIVar6[uVar23].Index;
        if (iVar19 <= iVar20) goto LAB_00148c54;
        (tab_bar->Tabs).Data[iVar20].Width = (float)(int)pIVar6[uVar23].Width;
        uVar23 = uVar23 + 1;
      } while ((long)iVar19 != uVar23);
    }
  }
  iVar19 = (tab_bar->Tabs).Size;
  if ((long)iVar19 < 1) {
    fVar42 = 0.0;
  }
  else {
    pIVar27 = (tab_bar->Tabs).Data;
    fVar46 = (pIVar17->Style).ItemInnerSpacing.x;
    fVar42 = 0.0;
    lVar21 = 0;
    do {
      *(float *)((long)&pIVar27->Offset + lVar21) = fVar42;
      if ((IVar33 == 0) &&
         (IVar33 = *(ImGuiID *)((long)&pIVar27->ID + lVar21), pIVar17->NavJustMovedToId != IVar33))
      {
        IVar33 = 0;
      }
      fVar42 = fVar42 + *(float *)((long)&pIVar27->Width + lVar21) + fVar46;
      lVar21 = lVar21 + 0x20;
    } while ((long)iVar19 << 5 != lVar21);
  }
  fVar42 = fVar42 - (pIVar17->Style).ItemInnerSpacing.x;
  fVar42 = (float)(-(uint)(0.0 <= fVar42) & (uint)fVar42);
  tab_bar->OffsetMax = fVar42;
  tab_bar->OffsetNextTab = 0.0;
  pIVar16 = GImGui;
  if (((1 < iVar19) &&
      (fVar46 = (tab_bar->BarRect).Min.x, (tab_bar->BarRect).Max.x - fVar46 < fVar42)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar5 = GImGui->CurrentWindow;
    fVar44 = GImGui->FontSize + -2.0;
    fVar42 = (GImGui->Style).FramePadding.y;
    fVar40 = fVar44 + fVar44;
    fVar43 = (tab_bar->BarRect).Max.x;
    fVar45 = (pIVar5->DC).CursorPos.x;
    bVar39 = false;
    if (((fVar46 <= fVar45) &&
        (fVar46 = (pIVar5->DC).CursorPos.y, bVar39 = false, (tab_bar->BarRect).Min.y <= fVar46)) &&
       (fVar45 + fVar40 <= fVar43)) {
      bVar39 = fVar46 <= (tab_bar->BarRect).Max.y;
    }
    local_48.y = fVar42 + fVar42 + GImGui->FontSize;
    local_48.x = fVar44;
    uStack_40 = 0;
    local_70 = (pIVar5->DC).CursorPos;
    if (!bVar39) {
      local_68.x = fVar43 + (GImGui->Style).ItemInnerSpacing.x;
      local_68.y = (tab_bar->BarRect).Max.y + 0.0;
      PushClipRect(&(tab_bar->BarRect).Min,(ImVec2 *)&local_68,true);
    }
    local_68.x = (pIVar16->Style).Colors[0].x;
    local_68.y = (pIVar16->Style).Colors[0].y;
    uVar12 = (pIVar16->Style).Colors[0].z;
    uVar13 = (pIVar16->Style).Colors[0].w;
    local_68.w = (float)uVar13 * 0.5;
    local_68.z = (float)uVar12;
    PushStyleColor(0,&local_68);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    unaff_R14.x = (pIVar16->IO).KeyRepeatDelay;
    unaff_R14.y = (pIVar16->IO).KeyRepeatRate;
    (pIVar16->IO).KeyRepeatDelay = 0.25;
    (pIVar16->IO).KeyRepeatRate = 0.2;
    fVar42 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = (tab_bar->BarRect).Max.x - fVar40;
    (pIVar5->DC).CursorPos.y = fVar42;
    bVar18 = ArrowButtonEx("##<",0,local_48,5);
    iVar19 = -(uint)bVar18;
    fVar42 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = fVar44 + ((tab_bar->BarRect).Max.x - fVar40);
    (pIVar5->DC).CursorPos.y = fVar42;
    pIVar27 = (ImGuiTabItem *)0x1;
    bVar18 = ArrowButtonEx("##>",1,local_48,5);
    if (bVar18) {
      iVar19 = 1;
    }
    PopStyleColor(2);
    (pIVar16->IO).KeyRepeatDelay = unaff_R14.x;
    (pIVar16->IO).KeyRepeatRate = unaff_R14.y;
    if (!bVar39) {
      PopClipRect();
    }
    if (iVar19 == 0) {
      pIVar27 = (ImGuiTabItem *)0x0;
    }
    else {
      IVar4 = tab_bar->SelectedTabId;
      if (IVar4 == 0) {
LAB_001488b5:
        pIVar27 = (ImGuiTabItem *)0x0;
      }
      else {
        uVar25 = (ulong)(tab_bar->Tabs).Size;
        bVar39 = 0 < (long)uVar25;
        if (0 < (long)uVar25) {
          pIVar27 = (tab_bar->Tabs).Data;
          bVar39 = true;
          if (pIVar27->ID != IVar4) {
            pIVar29 = pIVar27 + (uVar25 - 1);
            uVar23 = 0;
            pIVar28 = pIVar27;
            do {
              uVar26 = uVar25;
              pIVar27 = pIVar29;
              if (uVar25 - 1 == uVar23) break;
              pIVar27 = pIVar28 + 1;
              uVar26 = uVar23 + 1;
              pIVar1 = pIVar28 + 1;
              uVar23 = uVar26;
              pIVar28 = pIVar27;
            } while (pIVar1->ID != IVar4);
            bVar39 = uVar26 < uVar25;
          }
        }
        if (!bVar39) goto LAB_001488b5;
      }
      if (pIVar27 == (ImGuiTabItem *)0x0) {
        pIVar27 = (ImGuiTabItem *)0x0;
      }
      else {
        iVar20 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar27);
        iVar19 = iVar19 + iVar20;
        if ((iVar19 < 0) || ((tab_bar->Tabs).Size <= iVar19)) {
          iVar19 = iVar20;
        }
        if ((tab_bar->Tabs).Size <= iVar19) {
LAB_00148c54:
          pcVar24 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
LAB_00148c0c:
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                        ,0x4d7,pcVar24);
        }
        pIVar27 = (tab_bar->Tabs).Data + iVar19;
      }
    }
    (pIVar5->DC).CursorPos = local_70;
    (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - (fVar40 + 1.0);
    if (pIVar27 != (ImGuiTabItem *)0x0) {
      IVar33 = pIVar27->ID;
      tab_bar->SelectedTabId = IVar33;
    }
  }
  if (bVar38) {
    tab_bar->SelectedTabId = 0;
  }
  if (((tab_bar->SelectedTabId == 0) && (tab_bar->NextSelectedTabId == 0)) &&
     (IVar31 != (ImVec2)0x0)) {
    IVar33 = *(ImGuiID *)IVar31;
    tab_bar->SelectedTabId = IVar33;
  }
  tab_bar->VisibleTabId = tab_bar->SelectedTabId;
  tab_bar->VisibleTabWasSubmitted = false;
  if (IVar33 != 0) {
    uVar25 = (ulong)(tab_bar->Tabs).Size;
    bVar38 = 0 < (long)uVar25;
    if (0 < (long)uVar25) {
      unaff_R14 = (ImVec2)(tab_bar->Tabs).Data;
      bVar38 = true;
      if (*(ImGuiID *)unaff_R14 != IVar33) {
        IVar41 = (ImVec2)((long)unaff_R14 + (uVar25 - 1) * 0x20);
        uVar23 = 1;
        IVar31 = unaff_R14;
        do {
          uVar26 = uVar23;
          unaff_R14 = IVar41;
          if (uVar25 == uVar26) break;
          unaff_R14 = (ImVec2)((long)IVar31 + 0x20);
          pIVar36 = (ImGuiID *)((long)IVar31 + 0x20);
          uVar23 = uVar26 + 1;
          IVar31 = unaff_R14;
        } while (*pIVar36 != IVar33);
        bVar38 = uVar26 < uVar25;
      }
    }
    if ((bVar38) && (unaff_R14 != (ImVec2)0x0)) {
      fVar42 = GImGui->FontSize;
      iVar19 = ImGuiTabBar::GetTabOrder(tab_bar,(ImGuiTabItem *)unaff_R14);
      fVar46 = fVar42;
      if (iVar19 < 1) {
        fVar46 = -0.0;
      }
      fVar46 = *(float *)((long)unaff_R14 + 0x14) - fVar46;
      if ((tab_bar->Tabs).Size <= iVar19 + 1) {
        fVar42 = 1.0;
      }
      fVar42 = *(float *)((long)unaff_R14 + 0x14) + *(float *)((long)unaff_R14 + 0x18) + fVar42;
      tab_bar->ScrollingTargetDistToVisibility = 0.0;
      if (tab_bar->ScrollingTarget <= fVar46) {
        fVar45 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
        fVar43 = fVar42 - fVar45;
        if (fVar43 <= tab_bar->ScrollingTarget) goto LAB_00148a76;
        fVar42 = (fVar46 - fVar45) - tab_bar->ScrollingAnim;
      }
      else {
        fVar42 = tab_bar->ScrollingAnim - fVar42;
        fVar43 = fVar46;
      }
      tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar42) & (uint)fVar42);
      tab_bar->ScrollingTarget = fVar43;
    }
  }
LAB_00148a76:
  fVar46 = tab_bar->OffsetMax - ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x);
  fVar42 = tab_bar->ScrollingAnim;
  if (fVar46 <= tab_bar->ScrollingAnim) {
    fVar42 = fVar46;
  }
  fVar42 = (float)(-(uint)(0.0 <= fVar42) & (uint)fVar42);
  tab_bar->ScrollingAnim = fVar42;
  fVar43 = tab_bar->ScrollingTarget;
  if (fVar46 <= tab_bar->ScrollingTarget) {
    fVar43 = fVar46;
  }
  fVar43 = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43);
  tab_bar->ScrollingTarget = fVar43;
  if ((fVar42 != fVar43) || (NAN(fVar42) || NAN(fVar43))) {
    fVar46 = pIVar17->FontSize;
    fVar45 = fVar46 * 70.0;
    uVar32 = -(uint)(fVar45 <= tab_bar->ScrollingSpeed);
    fVar40 = ABS(fVar43 - fVar42) / 0.3;
    fVar45 = (float)(~uVar32 & (uint)fVar45 | (uint)tab_bar->ScrollingSpeed & uVar32);
    uVar32 = -(uint)(fVar40 <= fVar45);
    fVar40 = (float)(~uVar32 & (uint)fVar40 | uVar32 & (uint)fVar45);
    tab_bar->ScrollingSpeed = fVar40;
    fVar45 = fVar43;
    if ((pIVar17->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar46 * 10.0)) {
      fVar40 = fVar40 * (pIVar17->IO).DeltaTime;
      if (fVar43 <= fVar42) {
        fVar45 = fVar42;
        if (fVar43 < fVar42) {
          fVar42 = fVar42 - fVar40;
          uVar32 = -(uint)(fVar43 <= fVar42);
          fVar45 = (float)((uint)fVar42 & uVar32 | ~uVar32 & (uint)fVar43);
        }
      }
      else {
        fVar45 = fVar40 + fVar42;
        if (fVar43 <= fVar45) {
          fVar45 = fVar43;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar45;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  if ((tab_bar->Flags & 0x100000) == 0) {
    iVar19 = (tab_bar->TabsNames).Buf.Capacity;
    if (iVar19 < 0) {
      uVar32 = iVar19 / 2 + iVar19;
      size = 0;
      if (0 < (int)uVar32) {
        size = (size_t)uVar32;
      }
      __dest = (char *)MemAlloc(size);
      pcVar24 = (tab_bar->TabsNames).Buf.Data;
      if (pcVar24 != (char *)0x0) {
        memcpy(__dest,pcVar24,(long)(tab_bar->TabsNames).Buf.Size);
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest;
      (tab_bar->TabsNames).Buf.Capacity = (int)size;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  return;
LAB_00148bf7:
  pcVar24 = "T &ImVector<ImGuiTabBarSortItem>::operator[](int) [T = ImGuiTabBarSortItem]";
  goto LAB_00148c0c;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    ImVector<ImGuiTabBarSortItem>& width_sort_buffer = g.TabSortByWidthBuffer;
    width_sort_buffer.resize(tab_bar->Tabs.Size);

    // Compute ideal widths
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        tab->WidthContents = TabItemCalcSize(tab_name, (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true).x;

        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->WidthContents;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        width_sort_buffer[tab_n].Index = tab_n;
        width_sort_buffer[tab_n].Width = tab->WidthContents;
    }

    // Compute width
    const float width_avail = tab_bar->BarRect.GetWidth();
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        if (tab_bar->Tabs.Size > 1)
            ImQsort(width_sort_buffer.Data, (size_t)width_sort_buffer.Size, sizeof(ImGuiTabBarSortItem), TabBarSortItemComparer);
        int tab_count_same_width = 1;
        while (width_excess > 0.0f && tab_count_same_width < tab_bar->Tabs.Size)
        {
            while (tab_count_same_width < tab_bar->Tabs.Size && width_sort_buffer[0].Width == width_sort_buffer[tab_count_same_width].Width)
                tab_count_same_width++;
            float width_to_remove_per_tab_max = (tab_count_same_width < tab_bar->Tabs.Size) ? (width_sort_buffer[0].Width - width_sort_buffer[tab_count_same_width].Width) : (width_sort_buffer[0].Width - 1.0f);
            float width_to_remove_per_tab = ImMin(width_excess / tab_count_same_width, width_to_remove_per_tab_max);
            for (int tab_n = 0; tab_n < tab_count_same_width; tab_n++)
                width_sort_buffer[tab_n].Width -= width_to_remove_per_tab;
            width_excess -= width_to_remove_per_tab * tab_count_same_width;
        }
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[width_sort_buffer[tab_n].Index].Width = (float)(int)width_sort_buffer[tab_n].Width;
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->WidthContents, tab_max_width);
        }
    }

    // Layout all active tabs
    float offset_x = 0.0f;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetNextTab = 0.0f;

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);
}